

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_conjunction.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateExpression
          (StatisticsPropagator *this,BoundConjunctionExpression *expr,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  char cVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  ClientContext *context;
  Expression *pEVar4;
  bool bVar5;
  Expression *pEVar6;
  undefined8 uVar7;
  bool value;
  int iVar8;
  long lVar9;
  reference this_00;
  pointer pEVar10;
  type expr_00;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *__u;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *in_RCX;
  ulong __n;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> stats;
  Value constant;
  Expression *local_c8;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_c0;
  undefined1 local_b8 [32];
  char local_98;
  Value local_70;
  
  cVar1 = *(char *)&expr_ptr[1].
                    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                    _M_t.
                    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                    .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  local_c0 = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)(expr_ptr + 0xb);
  __n = 0;
  do {
    _Var2._M_head_impl =
         expr_ptr[0xb].
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    _Var3._M_head_impl =
         expr_ptr[0xc].
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    lVar9 = (long)_Var3._M_head_impl - (long)_Var2._M_head_impl;
    if ((ulong)(lVar9 >> 3) <= __n) {
      if (_Var2._M_head_impl != _Var3._M_head_impl) {
        if (lVar9 == 8) {
          __u = (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::get<true>(local_c0,0);
          ::std::__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>::
          operator=(in_RCX,__u);
        }
        this->optimizer = (Optimizer *)0x0;
        return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                )this;
      }
      Value::BOOLEAN((Value *)(local_b8 + 8),cVar1 == '2');
      make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                ((duckdb *)&local_70,(Value *)(local_b8 + 8));
      uVar7 = local_70.type_._0_8_;
      local_70.type_._0_8_ = (__node_base_ptr)0x0;
      pEVar4 = (in_RCX->_M_t).
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (in_RCX->_M_t).
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar7;
      if ((pEVar4 != (Expression *)0x0) &&
         ((*(pEVar4->super_BaseExpression)._vptr_BaseExpression[1])(),
         (__node_base_ptr)local_70.type_._0_8_ != (__node_base_ptr)0x0)) {
        (*(code *)(*(_Hash_node_base **)local_70.type_._0_8_)[1]._M_nxt)();
      }
      local_70.type_._0_8_ = (__node_base_ptr)0x0;
      Value::~Value((Value *)(local_b8 + 8));
      PropagateExpression(this,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)expr);
      return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>)
             this;
    }
    this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::get<true>(local_c0,__n);
    PropagateExpression((StatisticsPropagator *)local_b8,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)expr);
    pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(this_00);
    iVar8 = (*(pEVar10->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar10);
    bVar5 = true;
    if ((char)iVar8 != '\0') {
      context = *(ClientContext **)&(expr->super_Expression).super_BaseExpression.type;
      expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(this_00);
      ExpressionExecutor::EvaluateScalar((Value *)(local_b8 + 8),context,expr_00,false);
      bVar5 = true;
      if (local_98 == '\0') {
        value = BooleanValue::Get((Value *)(local_b8 + 8));
        if ((cVar1 == '2') == value) {
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          ::erase_at(local_c0,__n);
          __n = __n - 1;
        }
        else {
          Value::BOOLEAN(&local_70,value);
          make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)&local_c8,&local_70);
          pEVar6 = local_c8;
          local_c8 = (Expression *)0x0;
          pEVar4 = (in_RCX->_M_t).
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (in_RCX->_M_t).
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = pEVar6;
          if ((pEVar4 != (Expression *)0x0) &&
             ((*(pEVar4->super_BaseExpression)._vptr_BaseExpression[1])(),
             local_c8 != (Expression *)0x0)) {
            (**(code **)(*(long *)local_c8 + 8))();
          }
          local_c8 = (Expression *)0x0;
          Value::~Value(&local_70);
          PropagateExpression(this,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                    *)expr);
          bVar5 = false;
        }
      }
      Value::~Value((Value *)(local_b8 + 8));
    }
    ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
    ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
                local_b8);
    __n = __n + 1;
  } while (bVar5);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> StatisticsPropagator::PropagateExpression(BoundConjunctionExpression &expr,
                                                                     unique_ptr<Expression> &expr_ptr) {
	auto is_and = expr.GetExpressionType() == ExpressionType::CONJUNCTION_AND;
	for (idx_t expr_idx = 0; expr_idx < expr.children.size(); expr_idx++) {
		auto &child = expr.children[expr_idx];
		auto stats = PropagateExpression(child);
		if (!child->IsFoldable()) {
			continue;
		}
		// we have a constant in a conjunction
		// we (1) either prune the child
		// or (2) replace the entire conjunction with a constant
		auto constant = ExpressionExecutor::EvaluateScalar(context, *child);
		if (constant.IsNull()) {
			continue;
		}
		auto b = BooleanValue::Get(constant);
		bool prune_child = false;
		bool constant_value = true;
		if (b) {
			// true
			if (is_and) {
				// true in and: prune child
				prune_child = true;
			} else {
				// true in OR: replace with TRUE
				constant_value = true;
			}
		} else {
			// false
			if (is_and) {
				// false in AND: replace with FALSE
				constant_value = false;
			} else {
				// false in OR: prune child
				prune_child = true;
			}
		}
		if (prune_child) {
			expr.children.erase_at(expr_idx);
			expr_idx--;
			continue;
		}
		expr_ptr = make_uniq<BoundConstantExpression>(Value::BOOLEAN(constant_value));
		return PropagateExpression(expr_ptr);
	}
	if (expr.children.empty()) {
		// if there are no children left, replace the conjunction with TRUE (for AND) or FALSE (for OR)
		expr_ptr = make_uniq<BoundConstantExpression>(Value::BOOLEAN(is_and));
		return PropagateExpression(expr_ptr);
	} else if (expr.children.size() == 1) {
		// if there is one child left, replace the conjunction with that one child
		expr_ptr = std::move(expr.children[0]);
	}
	return nullptr;
}